

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O2

void __thiscall
helics::FilterFederate::processMessageFilter(FilterFederate *this,ActionMessage *cmd)

{
  GlobalHandle id;
  element_type *peVar1;
  _Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_> _Var2;
  undefined8 uVar3;
  __type_conflict _Var4;
  FilterInfo *pFVar5;
  action_t aVar6;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> tempMessage;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  new_messages;
  _Head_base<0UL,_helics::Message_*,_false> local_148;
  uint16_t local_13e;
  uint32_t local_13c;
  undefined8 local_138;
  __uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> local_130;
  __uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> local_128;
  __uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> local_120;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> local_118;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ActionMessage local_e8;
  
  if ((cmd->dest_id).gid != (this->mFedID).gid) {
    std::function<void_(const_helics::ActionMessage_&)>::operator()(&this->mSendMessage,cmd);
    return;
  }
  id.fed_id.gid = (cmd->dest_id).gid;
  id.handle.hid = (cmd->dest_handle).hid;
  pFVar5 = getFilterInfo(this,id);
  if (pFVar5 == (FilterInfo *)0x0) {
    return;
  }
  (this->mCoord).triggered = true;
  if (((pFVar5->flags & 0x1000) != 0) ||
     (peVar1 = (pFVar5->filterOp).
               super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar1 == (element_type *)0x0)) {
    aVar6 = cmd->messageAction;
    if ((aVar6 == cmd_send_for_dest_filter_return) || (aVar6 == cmd_send_for_filter_return)) {
      cmd->dest_id = (GlobalFederateId)(cmd->source_id).gid;
      cmd->dest_handle = (InterfaceHandle)(cmd->source_handle).hid;
      ActionMessage::setAction
                (cmd,(uint)(aVar6 == cmd_send_for_dest_filter_return) | cmd_filter_result);
      (cmd->source_handle).hid = (pFVar5->handle).hid;
      (cmd->source_id).gid = (this->mFedID).gid;
    }
    else {
      ActionMessage::setAction(cmd,cmd_send_message);
      cmd->dest_id = 0;
      cmd->dest_handle = -1700000000;
    }
    std::function<void_(helics::ActionMessage_&)>::operator()(&this->mDeliverMessage,cmd);
    return;
  }
  if (pFVar5->cloning == true) {
    createMessageFromCommand((helics *)&local_110,cmd);
    (*peVar1->_vptr_FilterOperator[3])(&local_108,peVar1,(helics *)&local_110);
    CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
              (&local_110);
    for (; local_108._M_dataplus._M_p != (pointer)local_108._M_string_length;
        local_108._M_dataplus._M_p = local_108._M_dataplus._M_p + 8) {
      _Var2.super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
           (_Head_base<0UL,_helics::Message_*,_false>)
           ((_Head_base<0UL,_helics::Message_*,_false> *)local_108._M_dataplus._M_p)->_M_head_impl;
      if (_Var2.super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl != (Message *)0x0) {
        ((_Head_base<0UL,_helics::Message_*,_false> *)local_108._M_dataplus._M_p)->_M_head_impl =
             (Message *)0x0;
        local_118._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
        ._M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
        super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
             (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             _Var2;
        ActionMessage::ActionMessage
                  (&local_e8,
                   (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_118)
        ;
        ActionMessage::operator=(cmd,&local_e8);
        ActionMessage::~ActionMessage(&local_e8);
        CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                  (&local_118);
        std::function<void_(helics::ActionMessage_&)>::operator()(&this->mDeliverMessage,cmd);
      }
    }
    std::
    vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    ::~vector((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
               *)&local_108);
    return;
  }
  aVar6 = cmd->messageAction;
  uVar3._0_4_ = cmd->source_id;
  uVar3._4_4_ = cmd->source_handle;
  local_13e = cmd->counter;
  local_13c = cmd->sequenceID;
  createMessageFromCommand((helics *)&local_148,cmd);
  std::__cxx11::string::string((string *)&local_108,&(local_148._M_head_impl)->dest);
  local_120._M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
  super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
       (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
       (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)local_148._M_head_impl;
  local_148._M_head_impl = (Message *)0x0;
  local_138 = uVar3;
  (*((pFVar5->filterOp).super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_FilterOperator[2])(&local_e8);
  uVar3 = local_e8._0_8_;
  local_e8._0_8_ = (__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>)0x0;
  std::__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>::reset
            ((__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> *)&local_148,
             (pointer)uVar3);
  CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_e8);
  CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_120);
  if (local_148._M_head_impl == (Message *)0x0) {
    ActionMessage::ActionMessage(&local_e8,cmd_ignore);
    ActionMessage::operator=(cmd,&local_e8);
    ActionMessage::~ActionMessage(&local_e8);
LAB_002a08c7:
    std::__cxx11::string::~string((string *)&local_108);
    CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_148);
    if ((aVar6 != cmd_send_for_dest_filter_return) && (aVar6 != cmd_send_for_filter_return)) {
      if (cmd->messageAction == cmd_ignore) {
        return;
      }
      (cmd->source_id).gid = (BaseType)local_138;
      (cmd->source_handle).hid = (BaseType)((ulong)local_138 >> 0x20);
      cmd->dest_id = 0;
      cmd->dest_handle = -1700000000;
      goto LAB_002a0953;
    }
  }
  else {
    _Var4 = std::operator==(&(local_148._M_head_impl)->dest,&local_108);
    if ((aVar6 != cmd_send_for_dest_filter_return) || (_Var4)) {
      local_130._M_t.
      super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
      super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
           (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
           (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)local_148._M_head_impl;
      local_148._M_head_impl = (Message *)0x0;
      ActionMessage::ActionMessage
                (&local_e8,
                 (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_130);
      ActionMessage::operator=(cmd,&local_e8);
      ActionMessage::~ActionMessage(&local_e8);
      CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_130);
      goto LAB_002a08c7;
    }
    local_128._M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
    super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)local_148._M_head_impl;
    local_148._M_head_impl = (Message *)0x0;
    ActionMessage::ActionMessage
              (&local_e8,
               (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_128);
    ActionMessage::operator=(cmd,&local_e8);
    ActionMessage::~ActionMessage(&local_e8);
    CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_128);
    cmd->dest_id = 0;
    cmd->dest_handle = -1700000000;
    std::function<void_(helics::ActionMessage_&)>::operator()(&this->mDeliverMessage,cmd);
    ActionMessage::ActionMessage(&local_e8,cmd_ignore);
    ActionMessage::operator=(cmd,&local_e8);
    ActionMessage::~ActionMessage(&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_148);
  }
  (cmd->dest_id).gid = (BaseType)local_138;
  (cmd->dest_handle).hid = (BaseType)((ulong)local_138 >> 0x20);
  cmd->counter = local_13e;
  cmd->sequenceID = local_13c;
  (cmd->source_handle).hid = (pFVar5->handle).hid;
  (cmd->source_id).gid = (this->mFedID).gid;
  if (cmd->messageAction == cmd_ignore) {
    aVar6 = (uint)(aVar6 == cmd_send_for_dest_filter_return) * 4 + cmd_null_message;
  }
  else {
    aVar6 = (uint)(aVar6 != cmd_send_for_dest_filter_return) ^ cmd_dest_filter_result;
  }
  ActionMessage::setAction(cmd,aVar6);
LAB_002a0953:
  std::function<void_(helics::ActionMessage_&)>::operator()(&this->mDeliverMessage,cmd);
  return;
}

Assistant:

void FilterFederate::processMessageFilter(ActionMessage& cmd)
{
    if (cmd.dest_id != mFedID) {
        mSendMessage(cmd);
    } else {
        // deal with local source filters
        auto* FiltI = getFilterInfo(cmd.getDest());
        if (FiltI != nullptr) {
            mCoord.triggered = true;
            if ((!checkActionFlag(*FiltI, disconnected_flag)) && (FiltI->filterOp)) {
                if (FiltI->cloning) {
                    auto new_messages =
                        FiltI->filterOp->processVector(createMessageFromCommand(std::move(cmd)));
                    for (auto& msg : new_messages) {
                        if (msg) {
                            cmd = ActionMessage(std::move(msg));
                            mDeliverMessage(cmd);
                        }
                    }
                } else {
                    bool destFilter = (cmd.action() == CMD_SEND_FOR_DEST_FILTER_AND_RETURN);
                    bool returnToSender =
                        ((cmd.action() == CMD_SEND_FOR_FILTER_AND_RETURN) || destFilter);
                    auto source = cmd.getSource();
                    auto filterCounter = cmd.counter;
                    auto seqID = cmd.sequenceID;
                    if (FiltI->filterOp) {
                        auto tempMessage = createMessageFromCommand(std::move(cmd));
                        auto dest = tempMessage->dest;
                        tempMessage = FiltI->filterOp->process(std::move(tempMessage));

                        if (tempMessage) {
                            if (tempMessage->dest != dest && destFilter) {
                                // the destination was altered we need to start the process over
                                cmd = ActionMessage(std::move(tempMessage));
                                cmd.dest_id = parent_broker_id;
                                cmd.dest_handle = InterfaceHandle{};
                                mDeliverMessage(cmd);
                                cmd = CMD_IGNORE;
                            } else {
                                cmd = ActionMessage(std::move(tempMessage));
                            }
                        } else {
                            cmd = CMD_IGNORE;
                        }
                    }

                    if (!returnToSender) {
                        if (cmd.action() == CMD_IGNORE) {
                            return;
                        }
                        cmd.setSource(source);
                        cmd.dest_id = parent_broker_id;
                        cmd.dest_handle = InterfaceHandle();
                        mDeliverMessage(cmd);
                    } else {
                        cmd.setDestination(source);
                        cmd.counter = filterCounter;
                        cmd.sequenceID = seqID;
                        cmd.source_handle = FiltI->handle;
                        cmd.source_id = mFedID;
                        if (cmd.action() == CMD_IGNORE) {
                            cmd.setAction(destFilter ? CMD_NULL_DEST_MESSAGE : CMD_NULL_MESSAGE);

                            mDeliverMessage(cmd);
                            return;
                        }
                        cmd.setAction(destFilter ? CMD_DEST_FILTER_RESULT : CMD_FILTER_RESULT);

                        mDeliverMessage(cmd);
                    }
                }
            } else {
                // the filter didn't have a function or was deactivated but still was requested to
                // process
                bool destFilter = (cmd.action() == CMD_SEND_FOR_DEST_FILTER_AND_RETURN);
                bool returnToSender =
                    ((cmd.action() == CMD_SEND_FOR_FILTER_AND_RETURN) || destFilter);
                auto source = cmd.getSource();
                if (!returnToSender) {
                    cmd.setAction(CMD_SEND_MESSAGE);
                    cmd.dest_id = parent_broker_id;
                    cmd.dest_handle = InterfaceHandle();
                    mDeliverMessage(cmd);
                } else {
                    cmd.setDestination(source);
                    cmd.setAction(destFilter ? CMD_DEST_FILTER_RESULT : CMD_FILTER_RESULT);

                    cmd.source_handle = FiltI->handle;
                    cmd.source_id = mFedID;
                    mDeliverMessage(cmd);
                }
            }
        } else {
            assert(false);
            // this is an odd condition (not sure what to do yet)
            /*    m.dest_id = filtFunc->sourceOperators[ii].fed_id;
                m.dest_handle = filtFunc->sourceOperators[ii].handle;
                if ((ii < static_cast<int> (filtFunc->sourceOperators.size() - 1)) ||
                    (filtFunc->finalSourceFilter.fed_id != invalid_fed_id))
                {
                    m.setAction(CMD_SEND_FOR_FILTER_OPERATION);
                }
                else
                {
                    m.setAction(CMD_SEND_FOR_FILTER);
                }
                return m;
                */
        }
    }
}